

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

optional<unsigned_int> __thiscall
google::protobuf::json_internal::anon_unknown_5::TakeTimeDigitsWithSuffixAndAdvance
          (anon_unknown_5 *this,string_view *data,int max_digits,string_view end)

{
  void *__s1;
  ulong uVar1;
  string *psVar2;
  ulong uVar3;
  undefined4 in_register_00000014;
  char *pcVar4;
  int iVar5;
  long lVar6;
  ulong unaff_R12;
  uint uVar7;
  
  uVar1 = CONCAT44(in_register_00000014,max_digits);
  if ((int)data < 10) {
    psVar2 = (string *)0x0;
  }
  else {
    psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((ulong)data & 0xffffffff,9,"max_digits <= 9");
  }
  if (psVar2 != (string *)0x0) {
    _GLOBAL__N_1::TakeTimeDigitsWithSuffixAndAdvance();
LAB_002ca735:
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",uVar1,
               unaff_R12);
  }
  lVar6 = *(long *)this;
  pcVar4 = *(char **)(this + 8);
  iVar5 = (int)data + 1;
  uVar7 = 0;
  while (lVar6 != 0) {
    iVar5 = iVar5 + -1;
    if (iVar5 < 0) goto LAB_002ca6d5;
    if (9 < (int)*pcVar4 - 0x30U) break;
    uVar7 = ((int)*pcVar4 - 0x30U) + uVar7 * 10;
    lVar6 = lVar6 + -1;
    pcVar4 = pcVar4 + 1;
    *(long *)this = lVar6;
    *(char **)(this + 8) = pcVar4;
  }
  unaff_R12 = *(ulong *)this;
  __s1 = *(void **)(this + 8);
  if ((uVar1 == 0) ||
     ((uVar1 <= unaff_R12 && (iVar5 = bcmp(__s1,(void *)end._M_len,uVar1), iVar5 == 0)))) {
    if (unaff_R12 < uVar1) goto LAB_002ca735;
    *(ulong *)this = unaff_R12 - uVar1;
    *(ulong *)(this + 8) = (long)__s1 + uVar1;
    uVar1 = (ulong)uVar7;
    uVar3 = 0x100000000;
  }
  else {
LAB_002ca6d5:
    uVar1 = 0;
    uVar3 = 0;
  }
  return (optional<unsigned_int>)(uVar1 | uVar3);
}

Assistant:

absl::optional<uint32_t> TakeTimeDigitsWithSuffixAndAdvance(
    absl::string_view& data, int max_digits, absl::string_view end) {
  ABSL_DCHECK_LE(max_digits, 9);

  uint32_t val = 0;
  int limit = max_digits;
  while (!data.empty()) {
    if (limit-- < 0) {
      return absl::nullopt;
    }
    uint32_t digit = data[0] - '0';
    if (digit >= 10) {
      break;
    }

    val *= 10;
    val += digit;
    data = data.substr(1);
  }
  if (!absl::StartsWith(data, end)) {
    return absl::nullopt;
  }

  data = data.substr(end.size());
  return val;
}